

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O1

void __thiscall Connection::onSocketError(Connection *this,SharedPtr *param_1,Error error)

{
  int *piVar1;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined1 local_90 [16];
  Log local_80;
  Log local_70;
  Log local_60;
  Log local_50;
  Log local_40;
  Log local_30;
  
  local_a0.mValue = 1;
  Log::Log(&local_50,LogLevel::Warning,(Flags<LogOutput::LogFlag> *)&local_a0);
  Log::write(&local_70,(int)&local_50,"Socket error",0xffffffff);
  Log::addStringStream<int>(&local_60,(int)&local_70);
  piVar1 = __errno_location();
  Log::addStringStream<int>(&local_80,(int)&local_60);
  Rct::strerror((Rct *)&local_a0,*piVar1);
  Log::write(&local_30,(int)&local_80,(void *)local_a0,(ulong)local_98);
  if (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  Log::Log(&local_40,&local_80);
  if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((undefined1 *)local_a0.mValue != local_90) {
    operator_delete((void *)local_a0);
  }
  if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mError,
             (shared_ptr<Connection> *)&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98));
  }
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98));
  }
  return;
}

Assistant:

void onSocketError(const SocketClient::SharedPtr&, SocketClient::Error error)
    {
        ::warning() << "Socket error" << error << errno << Rct::strerror();
        mError(shared_from_this());
        mDisconnected(shared_from_this());
    }